

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void BUF_MEM_free(BUF_MEM *a)

{
  char *unaff_retaddr;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  int line;
  
  if (a != (BUF_MEM *)0x0) {
    if (a->data != (char *)0x0) {
      line = (int)((ulong)a >> 0x20);
      if ((a[1].length & 1) == 0) {
        CRYPTO_clear_free(in_stack_00000010,in_stack_00000008,unaff_retaddr,line);
      }
      else {
        CRYPTO_secure_clear_free(in_stack_00000010,in_stack_00000008,unaff_retaddr,line);
      }
    }
    CRYPTO_free(a);
  }
  return;
}

Assistant:

void BUF_MEM_free(BUF_MEM *a)
{
    if (a == NULL)
        return;
    if (a->data != NULL) {
        if (a->flags & BUF_MEM_FLAG_SECURE)
            OPENSSL_secure_clear_free(a->data, a->max);
        else
            OPENSSL_clear_free(a->data, a->max);
    }
    OPENSSL_free(a);
}